

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffmkey(fitsfile *fptr,char *card,int *status)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  int local_8c;
  ulong uStack_88;
  int keylength;
  size_t ii;
  size_t len;
  char tcard [81];
  int *status_local;
  char *card_local;
  fitsfile *fptr_local;
  
  unique0x1000020e = status;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  strncpy((char *)&len,card,0x50);
  tcard[0x48] = '\0';
  uVar2 = strlen((char *)&len);
  for (uStack_88 = 0; uStack_88 < uVar2; uStack_88 = uStack_88 + 1) {
    if ((tcard[uStack_88 - 8] < ' ') || ('~' < tcard[uStack_88 - 8])) {
      tcard[uStack_88 - 8] = ' ';
    }
  }
  while (uStack_88 = uVar2, uStack_88 < 0x50) {
    tcard[uStack_88 - 8] = ' ';
    uVar2 = uStack_88 + 1;
  }
  sVar3 = strcspn((char *)&len,"=");
  local_8c = (int)sVar3;
  if (local_8c == 0x50) {
    local_8c = 8;
  }
  for (uStack_88 = 0; uStack_88 < (ulong)(long)local_8c; uStack_88 = uStack_88 + 1) {
    iVar1 = toupper((int)tcard[uStack_88 - 8]);
    tcard[uStack_88 - 8] = (char)iVar1;
  }
  fftkey((char *)&len,stack0xffffffffffffffe0);
  ffmbyt(fptr,fptr->Fptr->nextkey + -0x50,0,stack0xffffffffffffffe0);
  ffpbyt(fptr,0x50,&len,stack0xffffffffffffffe0);
  return *stack0xffffffffffffffe0;
}

Assistant:

int ffmkey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *card,  /* I - card string value  */
           int *status)       /* IO - error status      */
/*
  replace the previously read card (i.e. starting 80 bytes before the
  (fptr->Fptr)->nextkey position) with the contents of the input card.
*/
{
    char tcard[81];
    size_t len, ii;
    int keylength = 8;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    strncpy(tcard,card,80);
    tcard[80] = '\0';

    len = strlen(tcard);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)  
        if (tcard[ii] < ' ' || tcard[ii] > 126) tcard[ii] = ' ';

    for (ii=len; ii < 80; ii++)    /* fill card with spaces if necessary */
        tcard[ii] = ' ';

    keylength = strcspn(tcard, "=");
    if (keylength == 80) keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        tcard[ii] = toupper(tcard[ii]);

    fftkey(tcard, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(tcard, status);   */     /* test rest of keyword for legal chars   */

    /* move position of keyword to be over written */
    ffmbyt(fptr, ((fptr->Fptr)->nextkey) - 80, REPORT_EOF, status); 
    ffpbyt(fptr, 80, tcard, status);   /* write the 80 byte card */

    return(*status);
}